

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O1

void __thiscall
JUnitTestOutputTestRunner::JUnitTestOutputTestRunner
          (JUnitTestOutputTestRunner *this,TestResult *result)

{
  long lVar1;
  TestOutput **ppTVar2;
  TestOutput **ppTVar3;
  
  (this->result_)._vptr_TestResult = (_func_int **)&PTR__TestResult_003a7448;
  ppTVar2 = &result->output_;
  ppTVar3 = &(this->result_).output_;
  for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
    *ppTVar3 = *ppTVar2;
    ppTVar2 = ppTVar2 + 1;
    ppTVar3 = ppTVar3 + 1;
  }
  this->currentGroupName_ = (char *)0x0;
  this->currentTest_ = (UtestShell *)0x0;
  this->firstTestInGroup_ = true;
  this->timeTheTestTakes_ = 0;
  this->numberOfChecksInTest_ = 0;
  this->testFailure_ = (TestFailure *)0x0;
  millisTime = 0;
  theTime = "1978-10-03T00:00:00";
  CppUTestStore(&GetPlatformSpecificTimeInMillis);
  GetPlatformSpecificTimeInMillis = MockGetPlatformSpecificTimeInMillis;
  CppUTestStore(&GetPlatformSpecificTimeString);
  GetPlatformSpecificTimeString = MockGetPlatformSpecificTimeString;
  return;
}

Assistant:

explicit JUnitTestOutputTestRunner(const TestResult& result) :
        result_(result), currentGroupName_(NULLPTR), currentTest_(NULLPTR), firstTestInGroup_(true), timeTheTestTakes_(0), numberOfChecksInTest_(0), testFailure_(NULLPTR)
    {
        millisTime = 0;
        theTime =  "1978-10-03T00:00:00";

        UT_PTR_SET(GetPlatformSpecificTimeInMillis, MockGetPlatformSpecificTimeInMillis);
        UT_PTR_SET(GetPlatformSpecificTimeString, MockGetPlatformSpecificTimeString);
    }